

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

Variant * Jinx::operator*(Variant *__return_storage_ptr__,Variant *left,Variant *right)

{
  ValueType VVar1;
  ValueType VVar2;
  int64_t iVar3;
  int64_t iVar4;
  char *format;
  double dVar5;
  double dVar6;
  
  VVar1 = left->m_type;
  if (VVar1 - Number < 2) {
    VVar2 = right->m_type;
    if (VVar2 - Number < 2) {
      __return_storage_ptr__->m_type = Null;
      if (VVar2 == Integer && VVar1 == Integer) {
        iVar3 = Variant::GetInteger(left);
        iVar4 = Variant::GetInteger(right);
        Variant::Destroy(__return_storage_ptr__);
        __return_storage_ptr__->m_type = Integer;
        (__return_storage_ptr__->field_1).m_integer = iVar4 * iVar3;
        return __return_storage_ptr__;
      }
      dVar5 = Variant::GetNumber(left);
      dVar6 = Variant::GetNumber(right);
      Variant::Destroy(__return_storage_ptr__);
      __return_storage_ptr__->m_type = Number;
      (__return_storage_ptr__->field_1).m_number = dVar5 * dVar6;
      return __return_storage_ptr__;
    }
    format = "Invalid right operand for multiplication";
  }
  else {
    format = "Invalid left operand for multiplication";
  }
  Impl::LogWriteLine(Error,format);
  __return_storage_ptr__->m_type = Null;
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant operator * (const Variant & left, const Variant & right)
	{
		if (!left.IsNumericType())
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid left operand for multiplication");
			return Variant();
		}
		if (!right.IsNumericType())
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid right operand for multiplication");
			return Variant();
		}
		if (left.GetType() == ValueType::Integer && right.GetType() == ValueType::Integer)
		{
			Variant result;
			result.SetInteger(left.GetInteger() * right.GetInteger());
			return result;
		}
		else
		{
			Variant result;
			result.SetNumber(left.GetNumber() * right.GetNumber());
			return result;
		}
	}